

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O2

void __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::expand_
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this)

{
  pointer psVar1;
  uint64_t key;
  uint64_t i;
  ulong uVar2;
  long lVar3;
  this_type new_ht;
  
  standard_hash_table(&new_ht,(this->capa_size_).bits_ + 1);
  lVar3 = 8;
  for (uVar2 = 0;
      psVar1 = (this->table_).
               super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->table_).
                            super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
      uVar2 = uVar2 + 1) {
    key = *(uint64_t *)((long)psVar1 + lVar3 + -8);
    if (key != 0xffffffffffffffff) {
      set(&new_ht,key,*(uint64_t *)((long)&psVar1->key + lVar3));
    }
    lVar3 = lVar3 + 0x10;
  }
  operator=(this,&new_ht);
  std::
  _Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ::~_Vector_base((_Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                   *)&new_ht);
  return;
}

Assistant:

void expand_() {
        this_type new_ht{capa_size_.bits() + 1};
#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        for (uint64_t i = 0; i < table_.size(); ++i) {
            if (table_[i].key != UINT64_MAX) {
                new_ht.set(table_[i].key, table_[i].val);
            }
        }

        assert(size() == new_ht.size());
        *this = std::move(new_ht);
    }